

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polysolver.h
# Opt level: O3

vector<double,_std::allocator<double>_> *
Poly_Solver::poly_solve
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *v,double l,double r,double eps)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer pdVar6;
  pointer pdVar7;
  iterator __position;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [32];
  ulong uVar14;
  undefined1 auVar15 [16];
  vector<double,_std::allocator<double>_> *pvVar16;
  int iVar17;
  iterator __begin3;
  result_type rVar18;
  pointer pdVar19;
  uint uVar20;
  const_iterator __end1;
  const_iterator __end1_1;
  ulong uVar21;
  pointer pdVar22;
  pointer pdVar23;
  uint uVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [32];
  undefined1 in_XMM6 [16];
  double g;
  vector<double,_std::allocator<double>_> *__range1;
  vector<double,_std::allocator<double>_> nx;
  allocator_type local_a1;
  double local_a0;
  int local_94;
  double local_90;
  vector<double,_std::allocator<double>_> *local_88;
  vector<double,std::allocator<double>> *local_80;
  double local_78;
  vector<double,_std::allocator<double>_> local_70;
  vector<double,_std::allocator<double>_> local_58;
  double local_40;
  double local_38;
  
  local_90 = l;
  local_88 = v;
  local_78 = r;
  local_40 = eps;
  if (poly_solve(std::vector<double,std::allocator<double>>,double,double,double)::rng == '\0') {
    poly_solve();
  }
  local_38 = local_78 - local_90;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar24 = 0;
  iVar17 = 0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pdVar19 = (pointer)0x0;
  local_80 = (vector<double,std::allocator<double>> *)__return_storage_ptr__;
  do {
    pdVar6 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar7 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar22 = pdVar19;
    local_94 = iVar17;
    if ((ulong)((long)pdVar6 - (long)pdVar7) < 9) break;
    if (pdVar7 != pdVar6) {
      auVar27._8_8_ = 0x7fffffffffffffff;
      auVar27._0_8_ = 0x7fffffffffffffff;
      auVar34 = ZEXT864(0) << 0x40;
      pdVar22 = pdVar7;
      do {
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *pdVar22;
        pdVar22 = pdVar22 + 1;
        auVar36 = vandpd_avx(auVar36,auVar27);
        auVar36 = vmaxsd_avx(auVar36,auVar34._0_16_);
        auVar34 = ZEXT1664(auVar36);
      } while (pdVar22 != pdVar6);
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if (auVar36._0_8_ != 0.0 && pdVar7 != pdVar6) {
        auVar28 = vbroadcastsd_avx512f(auVar36);
        uVar21 = 0;
        auVar29 = vpbroadcastq_avx512f();
        auVar29 = vpsrlq_avx512f(auVar29,3);
        do {
          auVar30 = vpbroadcastq_avx512f();
          auVar30 = vporq_avx512f(auVar30,auVar34);
          uVar14 = vpcmpuq_avx512f(auVar30,auVar29,2);
          pdVar22 = pdVar7 + uVar21;
          auVar30._8_8_ = (ulong)((byte)(uVar14 >> 1) & 1) * (long)pdVar22[1];
          auVar30._0_8_ = (ulong)((byte)uVar14 & 1) * (long)*pdVar22;
          auVar30._16_8_ = (ulong)((byte)(uVar14 >> 2) & 1) * (long)pdVar22[2];
          auVar30._24_8_ = (ulong)((byte)(uVar14 >> 3) & 1) * (long)pdVar22[3];
          auVar30._32_8_ = (ulong)((byte)(uVar14 >> 4) & 1) * (long)pdVar22[4];
          auVar30._40_8_ = (ulong)((byte)(uVar14 >> 5) & 1) * (long)pdVar22[5];
          auVar30._48_8_ = (ulong)((byte)(uVar14 >> 6) & 1) * (long)pdVar22[6];
          auVar30._56_8_ = (uVar14 >> 7) * (long)pdVar22[7];
          auVar30 = vdivpd_avx512f(auVar30,auVar28);
          pdVar22 = pdVar7 + uVar21;
          bVar26 = (bool)((byte)uVar14 & 1);
          bVar25 = (bool)((byte)(uVar14 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar14 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar14 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar14 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar14 >> 6) & 1);
          *pdVar22 = (double)((ulong)bVar26 * auVar30._0_8_ | (ulong)!bVar26 * (long)*pdVar22);
          pdVar22[1] = (double)((ulong)bVar25 * auVar30._8_8_ | (ulong)!bVar25 * (long)pdVar22[1]);
          pdVar22[2] = (double)((ulong)bVar8 * auVar30._16_8_ | (ulong)!bVar8 * (long)pdVar22[2]);
          pdVar22[3] = (double)((ulong)bVar9 * auVar30._24_8_ | (ulong)!bVar9 * (long)pdVar22[3]);
          pdVar22[4] = (double)((ulong)bVar10 * auVar30._32_8_ | (ulong)!bVar10 * (long)pdVar22[4]);
          pdVar22[5] = (double)((ulong)bVar11 * auVar30._40_8_ | (ulong)!bVar11 * (long)pdVar22[5]);
          pdVar22[6] = (double)((ulong)bVar12 * auVar30._48_8_ | (ulong)!bVar12 * (long)pdVar22[6]);
          pdVar22[7] = (double)((uVar14 >> 7) * auVar30._56_8_ |
                               (ulong)!SUB81(uVar14 >> 7,0) * (long)pdVar22[7]);
          uVar21 = uVar21 + 8;
        } while (((((long)pdVar6 - (long)pdVar7) - 8U >> 3) + 8 & 0xfffffffffffffff8) != uVar21);
      }
    }
    std::vector<double,_std::allocator<double>_>::vector(&local_58,local_88);
    pdVar6 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar22 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar40._8_4_ = 8;
    auVar40._0_8_ = 0x800000008;
    auVar40._12_4_ = 8;
    auVar40._16_4_ = 8;
    auVar40._20_4_ = 8;
    auVar40._24_4_ = 8;
    auVar40._28_4_ = 8;
    iVar17 = (int)((ulong)((long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start) >> 3);
    if (1 < iVar17) {
      auVar13 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
      uVar21 = 0;
      auVar28 = vpbroadcastq_avx512f();
      do {
        auVar29 = vpbroadcastq_avx512f();
        auVar29 = vporq_avx512f(auVar29,auVar34);
        uVar14 = vpcmpuq_avx512f(auVar29,auVar28,2);
        auVar29 = vcvtudq2pd_avx512f(auVar13);
        auVar13 = vpaddd_avx2(auVar13,auVar40);
        pdVar7 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar21 + 1;
        auVar31._8_8_ = (ulong)((byte)(uVar14 >> 1) & 1) * (long)pdVar7[1];
        auVar31._0_8_ = (ulong)((byte)uVar14 & 1) * (long)*pdVar7;
        auVar31._16_8_ = (ulong)((byte)(uVar14 >> 2) & 1) * (long)pdVar7[2];
        auVar31._24_8_ = (ulong)((byte)(uVar14 >> 3) & 1) * (long)pdVar7[3];
        auVar31._32_8_ = (ulong)((byte)(uVar14 >> 4) & 1) * (long)pdVar7[4];
        auVar31._40_8_ = (ulong)((byte)(uVar14 >> 5) & 1) * (long)pdVar7[5];
        auVar31._48_8_ = (ulong)((byte)(uVar14 >> 6) & 1) * (long)pdVar7[6];
        auVar31._56_8_ = (uVar14 >> 7) * (long)pdVar7[7];
        auVar29 = vmulpd_avx512f(auVar31,auVar29);
        pdVar7 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar21;
        bVar26 = (bool)((byte)uVar14 & 1);
        bVar25 = (bool)((byte)(uVar14 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar14 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar14 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar14 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar14 >> 6) & 1);
        *pdVar7 = (double)((ulong)bVar26 * auVar29._0_8_ | (ulong)!bVar26 * (long)*pdVar7);
        pdVar7[1] = (double)((ulong)bVar25 * auVar29._8_8_ | (ulong)!bVar25 * (long)pdVar7[1]);
        pdVar7[2] = (double)((ulong)bVar8 * auVar29._16_8_ | (ulong)!bVar8 * (long)pdVar7[2]);
        pdVar7[3] = (double)((ulong)bVar9 * auVar29._24_8_ | (ulong)!bVar9 * (long)pdVar7[3]);
        pdVar7[4] = (double)((ulong)bVar10 * auVar29._32_8_ | (ulong)!bVar10 * (long)pdVar7[4]);
        pdVar7[5] = (double)((ulong)bVar11 * auVar29._40_8_ | (ulong)!bVar11 * (long)pdVar7[5]);
        pdVar7[6] = (double)((ulong)bVar12 * auVar29._48_8_ | (ulong)!bVar12 * (long)pdVar7[6]);
        pdVar7[7] = (double)((uVar14 >> 7) * auVar29._56_8_ |
                            (ulong)!SUB81(uVar14 >> 7,0) * (long)pdVar7[7]);
        uVar21 = uVar21 + 8;
      } while (((ulong)(iVar17 - 1) + 7 & 0xfffffffffffffff8) != uVar21);
    }
    bVar26 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish ==
             local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if ((pdVar19 != (pointer)0x0) &&
       (operator_delete(pdVar19),
       local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start != (pointer)0x0)) {
      operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    rVar18 = std::
             mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             ::operator()(&poly_solve::rng);
    auVar27 = vcvtusi2sd_avx512f(in_XMM6,rVar18);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_38;
    uVar24 = uVar24 + 1;
    auVar32._0_8_ = (double)(float)(auVar27._0_8_ / 4294967295.0);
    auVar32._8_8_ = auVar27._8_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_90;
    auVar33 = vfmadd213sd_fma(auVar32,auVar37,auVar1);
    dVar39 = local_78;
    if ((uVar24 % 5 == 1) || (dVar39 = local_90, uVar24 % 5 == 0)) {
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar39;
    }
    auVar34 = ZEXT1664(auVar33);
    pdVar19 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar7 = (local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar20 = 1;
    do {
      dVar35 = 0.0;
      auVar28 = ZEXT864(0) << 0x40;
      dVar39 = 0.0;
      local_a0 = auVar34._0_8_;
      if (pdVar19 != pdVar7) {
        auVar34 = ZEXT1664(ZEXT816(0x3ff0000000000000));
        pdVar23 = pdVar19;
        do {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *pdVar23;
          auVar27 = vfmadd231sd_fma(auVar28._0_16_,auVar34._0_16_,auVar2);
          dVar39 = auVar27._0_8_;
          auVar28 = ZEXT1664(auVar27);
          auVar34 = ZEXT864((ulong)(local_a0 * auVar34._0_8_));
          pdVar23 = pdVar23 + 1;
        } while (pdVar23 != pdVar7);
      }
      if (pdVar22 != pdVar6 + ((ulong)bVar26 - 1)) {
        auVar28 = ZEXT1664(ZEXT816(0x3ff0000000000000));
        auVar34 = ZEXT864(0) << 0x40;
        pdVar23 = pdVar22;
        do {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *pdVar23;
          auVar27 = vfmadd231sd_fma(auVar34._0_16_,auVar28._0_16_,auVar3);
          auVar34 = ZEXT1664(auVar27);
          dVar35 = auVar27._0_8_;
          auVar28 = ZEXT864((ulong)(local_a0 * auVar28._0_8_));
          pdVar23 = pdVar23 + 1;
        } while (pdVar23 != pdVar6 + ((ulong)bVar26 - 1));
      }
      local_a0 = local_a0 - dVar39 / dVar35;
      auVar34 = ZEXT864((ulong)local_a0);
    } while (((-10000000000.0 <= local_a0) && (local_a0 <= 10000000000.0)) &&
            (bVar25 = uVar20 < 0x1e, uVar20 = uVar20 + 1, bVar25));
    if ((local_a0 < -10000000000.0) || (10000000000.0 < local_a0)) {
      iVar17 = local_94 + 1;
    }
    else {
      auVar27 = ZEXT816(0);
      if (pdVar19 != pdVar7) {
        auVar34 = ZEXT1664(ZEXT816(0x3ff0000000000000));
        do {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *pdVar19;
          auVar27 = vfmadd231sd_fma(auVar27,auVar34._0_16_,auVar4);
          auVar34 = ZEXT864((ulong)(local_a0 * auVar34._0_8_));
          pdVar19 = pdVar19 + 1;
        } while (pdVar19 != pdVar7);
      }
      auVar15._8_8_ = 0x7fffffffffffffff;
      auVar15._0_8_ = 0x7fffffffffffffff;
      auVar27 = vandpd_avx512vl(auVar27,auVar15);
      if (auVar27._0_8_ <= local_40) {
        if ((local_90 <= local_a0) && (local_a0 <= local_78)) {
          __position._M_current = *(double **)(local_80 + 8);
          if (__position._M_current == *(double **)(local_80 + 0x10)) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (local_80,__position,&local_a0);
          }
          else {
            *__position._M_current = local_a0;
            *(double **)(local_80 + 8) = __position._M_current + 1;
          }
        }
        pvVar16 = local_88;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_70,
                   (long)(local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(local_88->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3,&local_a1);
        pdVar19 = (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar20 = (uint)((ulong)((long)(pvVar16->super__Vector_base<double,_std::allocator<double>_>)
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar19) >>
                       3);
        if (1 < (int)uVar20) {
          uVar21 = (ulong)(uVar20 & 0x7fffffff);
          auVar34 = ZEXT864((ulong)pdVar19[uVar21 - 1]);
          uVar21 = uVar21 + 1;
          do {
            local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar21 - 2] = auVar34._0_8_;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = local_a0;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = pdVar19[uVar21 - 3];
            auVar27 = vfmadd213sd_fma(auVar34._0_16_,auVar38,auVar5);
            auVar34 = ZEXT1664(auVar27);
            pdVar19[uVar21 - 3] = auVar27._0_8_;
            uVar21 = uVar21 - 1;
          } while (2 < uVar21);
        }
        pdVar19 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
        if (pdVar19 !=
            local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memmove(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,pdVar19,
                  (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar19);
        }
        local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1;
        std::vector<double,_std::allocator<double>_>::operator=(local_88,&local_70);
        if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        iVar17 = 0;
      }
      else {
        iVar17 = local_94 + 2;
      }
    }
    pdVar19 = pdVar22;
  } while (iVar17 < 0xe);
  if (pdVar22 != (pointer)0x0) {
    operator_delete(pdVar22);
  }
  return (vector<double,_std::allocator<double>_> *)local_80;
}

Assistant:

vector<double> poly_solve(vector<double> v, double l, double r, double eps = 1e-8) {
		static RNG_TYPE rng;
		vector<double> dv, s;
		int retry = 0, tat=0;
		while (v.size() > 1) {
			double mx = 0;
			for (auto t : v) mx = max(mx, fabs(t));
			if (mx)
			{
				for (auto& t : v) t /= mx;
			}
			dv = de(v);
			double g = l + randf(rng) * (r - l);
			++tat;
			if (tat % 5 == 0) g = l;
			else if (tat % 5 == 1) g = r;
			for (int j = 1; j <= 30; ++j) {
				g = g - poly_calc(v, g) / poly_calc(dv, g);
				if (g != g || g > 1e10 || g < -1e10)
					break;
			}
			if (g != g || g > 1e10 || g < -1e10) ++retry;
			else if (fabs(poly_calc(v, g)) > eps) retry += 2;
			else {
				retry = 0;
				if (g >= l && g <= r) s.push_back(g);
				vector<double> nx(v.size());
				//v/(x-g)
				for (int j = (int)v.size() - 1; j >= 1; --j) {
					nx[j] = v[j]; v[j - 1] += v[j] * g;
				}
				nx.erase(nx.begin()); v = nx;
			}
			if (retry >= 14) break;
		}
		return s;
		/*
		if (v.size() == 0)
			return vector<double>();
//		v = poly_normalized(v);
		vector<double> w = poly_solve(de(v), l, r, eps, false), o;
		w.insert(w.begin(), l);
		w.push_back(r);
		for (int j = 0; j + 1 < (int)w.size(); ++j) {
			double a = w[j], b = w[j+1], fa = poly_calc(v, a), fb = poly_calc(v, b);
			if (fabs(fa) < eps) {
				o.push_back(a);
				continue;
			}
			if (fabs(fb) < eps) {
				o.push_back(b);
				continue;
			}
			if ((fa > 0) == (fb > 0))
				continue;
			for (int k = 0; k < 100 && (a!=b); ++k) {
				double m = (a + b) / 2, fm = poly_calc(v, m);
				if ((fa > 0) ^ (fm > 0)) b = m, fb = fm;
				else a = m, fa = fm;
			}
			o.push_back(a);
		}
		if (verify)
		{
			vector<double> oo;
			for (auto g : o)
				if (fabs(poly_calc(v, g)) < eps) oo.push_back(g);
			o = oo;
		}
		return o;*/
	}